

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::BatchNormParameter::Clear(BatchNormParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->use_global_stats_ = false;
    this->moving_average_fraction_ = 0.999;
    this->eps_ = 1e-05;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void BatchNormParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.BatchNormParameter)
  if (_has_bits_[0 / 32] & 7u) {
    use_global_stats_ = false;
    moving_average_fraction_ = 0.999f;
    eps_ = 1e-05f;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}